

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_8x8.c
# Opt level: O2

void ihevc_itrans_recon_8x8
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  undefined2 uVar6;
  int iVar7;
  short *psVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int local_d8 [4];
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  int aiStack_b8 [4];
  short *local_a8;
  undefined8 local_a0;
  long local_98;
  uint local_8c;
  int local_88;
  int local_84;
  WORD32 e [4];
  WORD32 o [4];
  
  local_8c = zero_cols & 0xf0U;
  local_a0._0_4_ = (uint)((zero_cols & 0xf0U) != 0xf0) * 4 + 4;
  e[2] = (int)(long)(src_strd * 3);
  e[3] = (int)((ulong)(long)(src_strd * 3) >> 0x20);
  local_a8 = pi2_tmp;
  if ((~zero_rows & 0xf0U) == 0) {
    local_bc = 0x53;
    local_98 = (long)(src_strd * 2);
    local_c0 = 0x24;
    local_c4 = 0x40;
    local_c8 = 0x40;
    for (iVar10 = 0; psVar8 = local_a8, iVar10 != (int)local_a0; iVar10 = iVar10 + 1) {
      if ((zero_cols & 1U) == 0) {
        sVar1 = pi2_src[src_strd];
        sVar2 = pi2_src[e._8_8_];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar7 = (int)pi2_src[local_98];
        iVar11 = *pi2_src * 0x40;
        iVar5 = *pi2_src * 0x40;
        local_d8[0] = iVar5 + iVar7 * 0x53;
        local_d8[3] = iVar5 + iVar7 * -0x53;
        local_d8[1] = iVar11 + iVar7 * 0x24;
        local_d8[2] = iVar11 + iVar7 * -0x24;
        lVar9 = 0xc;
        for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 2) {
          iVar5 = *(int *)((long)local_d8 + lVar13 * 2) + *(int *)((long)aiStack_b8 + lVar13 * 2) +
                  0x40 >> 7;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          uVar6 = (undefined2)iVar5;
          if (0x7ffe < iVar5) {
            uVar6 = 0x7fff;
          }
          *(undefined2 *)((long)pi2_tmp + lVar13) = uVar6;
          iVar5 = (*(int *)((long)local_d8 + lVar9) - *(int *)((long)aiStack_b8 + lVar9)) + 0x40 >>
                  7;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          *(short *)((long)pi2_tmp + lVar13 + 8) = (short)iVar5;
          lVar9 = lVar9 + -4;
        }
      }
      else {
        pi2_tmp[0] = 0;
        pi2_tmp[1] = 0;
        pi2_tmp[2] = 0;
        pi2_tmp[3] = 0;
        pi2_tmp[4] = 0;
        pi2_tmp[5] = 0;
        pi2_tmp[6] = 0;
        pi2_tmp[7] = 0;
      }
      pi2_src = pi2_src + 1;
      pi2_tmp = pi2_tmp + 8;
      zero_cols = zero_cols >> 1;
    }
    if (local_8c == 0xf0) {
      for (iVar10 = 0; iVar10 != 8; iVar10 = iVar10 + 1) {
        sVar1 = psVar8[8];
        sVar2 = psVar8[0x18];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar7 = (int)psVar8[0x10];
        iVar5 = *psVar8 * 0x40;
        iVar11 = *psVar8 * 0x40;
        local_d8[0] = iVar11 + iVar7 * 0x53;
        local_d8[3] = iVar11 + iVar7 * -0x53;
        local_d8[1] = iVar5 + iVar7 * 0x24;
        local_d8[2] = iVar5 + iVar7 * -0x24;
        lVar13 = 0xc;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar5 = local_d8[lVar9] + aiStack_b8[lVar9] + 0x800 >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9] = (UWORD8)iVar5;
          iVar5 = (*(int *)((long)local_d8 + lVar13) - *(int *)((long)aiStack_b8 + lVar13)) + 0x800
                  >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9 + 4] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9 + 4] = (UWORD8)iVar5;
          lVar13 = lVar13 + -4;
        }
        psVar8 = psVar8 + 1;
        pu1_pred = pu1_pred + pred_strd;
        pu1_dst = pu1_dst + dst_strd;
      }
    }
    else {
      local_a0 = CONCAT44(local_a0._4_4_,0x24);
      local_a8 = (short *)CONCAT44(local_a8._4_4_,0xffffffad);
      e[2] = -0x40;
      local_98 = (long)pred_strd;
      e[0] = (int)(long)dst_strd;
      e[1] = (int)((ulong)(long)dst_strd >> 0x20);
      for (iVar10 = 0; iVar10 != 8; iVar10 = iVar10 + 1) {
        sVar1 = psVar8[8];
        sVar2 = psVar8[0x18];
        sVar3 = psVar8[0x28];
        sVar4 = psVar8[0x38];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[7][lVar13] * (int)sVar4 +
               (int)g_ai2_ihevc_trans_8[5][lVar13] * (int)sVar3 +
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar11 = psVar8[0x30] * (int)local_a0 + psVar8[0x10] * 0x53;
        iVar7 = psVar8[0x30] * (int)local_a8 + psVar8[0x10] * 0x24;
        iVar12 = psVar8[0x20] * 0x40 + *psVar8 * 0x40;
        iVar5 = psVar8[0x20] * e[2] + *psVar8 * 0x40;
        local_d8[0] = iVar12 + iVar11;
        local_d8[3] = iVar12 - iVar11;
        local_d8[1] = iVar5 + iVar7;
        local_d8[2] = iVar5 - iVar7;
        lVar13 = 0xc;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar5 = local_d8[lVar9] + aiStack_b8[lVar9] + 0x800 >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9] = (UWORD8)iVar5;
          iVar5 = (*(int *)((long)local_d8 + lVar13) - *(int *)((long)aiStack_b8 + lVar13)) + 0x800
                  >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9 + 4] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9 + 4] = (UWORD8)iVar5;
          lVar13 = lVar13 + -4;
        }
        psVar8 = psVar8 + 1;
        pu1_pred = pu1_pred + local_98;
        pu1_dst = pu1_dst + e._0_8_;
      }
    }
  }
  else {
    local_bc = 0x53;
    local_98 = CONCAT44(local_98._4_4_,0x24);
    local_c0 = 0x24;
    e[0] = -0x53;
    local_c4 = 0x40;
    local_84 = 0x40;
    local_c8 = 0x40;
    local_88 = -0x40;
    for (iVar10 = 0; psVar8 = local_a8, iVar10 != (int)local_a0; iVar10 = iVar10 + 1) {
      if ((zero_cols & 1U) == 0) {
        sVar1 = pi2_src[src_strd];
        sVar2 = pi2_src[e._8_8_];
        sVar3 = pi2_src[src_strd * 5];
        sVar4 = pi2_src[src_strd * 7];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[7][lVar13] * (int)sVar4 +
               (int)g_ai2_ihevc_trans_8[5][lVar13] * (int)sVar3 +
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar11 = pi2_src[src_strd * 6] * (int)local_98 + pi2_src[src_strd * 2] * 0x53;
        iVar7 = pi2_src[src_strd * 6] * e[0] + pi2_src[src_strd * 2] * 0x24;
        iVar12 = pi2_src[src_strd << 2] * local_84 + *pi2_src * 0x40;
        iVar5 = pi2_src[src_strd << 2] * local_88 + *pi2_src * 0x40;
        local_d8[0] = iVar12 + iVar11;
        local_d8[3] = iVar12 - iVar11;
        local_d8[1] = iVar5 + iVar7;
        local_d8[2] = iVar5 - iVar7;
        lVar13 = 0xc;
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 2) {
          iVar5 = *(int *)((long)aiStack_b8 + lVar9 * 2) + *(int *)((long)local_d8 + lVar9 * 2) +
                  0x40 >> 7;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          uVar6 = (undefined2)iVar5;
          if (0x7ffe < iVar5) {
            uVar6 = 0x7fff;
          }
          *(undefined2 *)((long)pi2_tmp + lVar9) = uVar6;
          iVar5 = (*(int *)((long)local_d8 + lVar13) - *(int *)((long)aiStack_b8 + lVar13)) + 0x40
                  >> 7;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          *(short *)((long)pi2_tmp + lVar9 + 8) = (short)iVar5;
          lVar13 = lVar13 + -4;
        }
      }
      else {
        pi2_tmp[0] = 0;
        pi2_tmp[1] = 0;
        pi2_tmp[2] = 0;
        pi2_tmp[3] = 0;
        pi2_tmp[4] = 0;
        pi2_tmp[5] = 0;
        pi2_tmp[6] = 0;
        pi2_tmp[7] = 0;
      }
      pi2_src = pi2_src + 1;
      pi2_tmp = pi2_tmp + 8;
      zero_cols = zero_cols >> 1;
    }
    local_a0 = (long)pred_strd;
    local_a8 = (short *)(long)dst_strd;
    if (local_8c == 0xf0) {
      for (iVar10 = 0; iVar10 != 8; iVar10 = iVar10 + 1) {
        sVar1 = psVar8[8];
        sVar2 = psVar8[0x18];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar7 = (int)psVar8[0x10];
        iVar5 = *psVar8 * 0x40;
        iVar11 = *psVar8 * 0x40;
        local_d8[0] = iVar11 + iVar7 * 0x53;
        local_d8[3] = iVar11 + iVar7 * -0x53;
        local_d8[1] = iVar5 + iVar7 * 0x24;
        local_d8[2] = iVar5 + iVar7 * -0x24;
        lVar13 = 0xc;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar5 = local_d8[lVar9] + aiStack_b8[lVar9] + 0x800 >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9] = (UWORD8)iVar5;
          iVar5 = (*(int *)((long)local_d8 + lVar13) - *(int *)((long)aiStack_b8 + lVar13)) + 0x800
                  >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9 + 4] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9 + 4] = (UWORD8)iVar5;
          lVar13 = lVar13 + -4;
        }
        psVar8 = psVar8 + 1;
        pu1_pred = pu1_pred + local_a0;
        pu1_dst = pu1_dst + (long)local_a8;
      }
    }
    else {
      for (iVar10 = 0; iVar10 != 8; iVar10 = iVar10 + 1) {
        sVar1 = psVar8[8];
        sVar2 = psVar8[0x18];
        sVar3 = psVar8[0x28];
        sVar4 = psVar8[0x38];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          aiStack_b8[lVar13] =
               (int)g_ai2_ihevc_trans_8[7][lVar13] * (int)sVar4 +
               (int)g_ai2_ihevc_trans_8[5][lVar13] * (int)sVar3 +
               (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
               (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
        }
        iVar11 = psVar8[0x30] * (int)local_98 + psVar8[0x10] * 0x53;
        iVar7 = psVar8[0x30] * e[0] + psVar8[0x10] * 0x24;
        iVar5 = psVar8[0x20] * local_84 + *psVar8 * 0x40;
        iVar12 = psVar8[0x20] * local_88 + *psVar8 * 0x40;
        local_d8[0] = iVar5 + iVar11;
        local_d8[3] = iVar5 - iVar11;
        local_d8[1] = iVar12 + iVar7;
        local_d8[2] = iVar12 - iVar7;
        lVar13 = 0xc;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar5 = local_d8[lVar9] + aiStack_b8[lVar9] + 0x800 >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9] = (UWORD8)iVar5;
          iVar5 = (*(int *)((long)local_d8 + lVar13) - *(int *)((long)aiStack_b8 + lVar13)) + 0x800
                  >> 0xc;
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          iVar5 = (uint)pu1_pred[lVar9 + 4] + iVar5;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[lVar9 + 4] = (UWORD8)iVar5;
          lVar13 = lVar13 + -4;
        }
        psVar8 = psVar8 + 1;
        pu1_pred = pu1_pred + local_a0;
        pu1_dst = pu1_dst + (long)local_a8;
      }
    }
  }
  return;
}

Assistant:

void ihevc_itrans_recon_8x8(WORD16 *pi2_src,
                            WORD16 *pi2_tmp,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols,
                            WORD32 zero_rows)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    WORD32 zero_rows_2nd_stage = zero_cols;
    WORD32 row_limit_2nd_stage;

    trans_size = TRANS_SIZE_8;

    pi2_tmp_orig = pi2_tmp;

    if((zero_cols & 0xF0) == 0xF0)
        row_limit_2nd_stage = 4;
    else
        row_limit_2nd_stage = TRANS_SIZE_8;


    if((zero_rows & 0xF0) == 0xF0) /* First 4 rows of input are non-zero */
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        /* Inverse Transform 1st stage */
        shift = IT_SHIFT_STAGE_1;
        add = 1 << (shift - 1);

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);
        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k] * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
    else /* All rows of input are non-zero */
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        /* Inverse Transform 1st stage */
        shift = IT_SHIFT_STAGE_1;
        add = 1 << (shift - 1);

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_src[5 * src_strd]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_src[7 * src_strd];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);
        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k] * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
}